

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseCoDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  int iVar4;
  undefined8 *puVar5;
  DataKey DVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  steeppr *psVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_2e8;
  ulong local_2e0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  fpclass_type local_240;
  int32_t iStack_23c;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  steeppr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  uStack_24b = 0;
  lVar16 = (long)(pSVar1->thevectors->set).thenum;
  if (lVar16 < 1) {
    DVar6.info = 0;
    DVar6.idx = -1;
  }
  else {
    local_2e0 = 0xffffffff;
    lVar15 = 0;
    lVar17 = 0x78;
    local_2e8.info = 0;
    local_2e8.idx = 0;
    do {
      puVar5 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar17);
      puVar8 = (uint *)(puVar5 + -0xf);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar11->data)._M_elems[0] = *puVar8;
        puVar8 = puVar8 + (ulong)bVar18 * -2 + 1;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
      }
      iStack_248 = *(int *)(puVar5 + -1);
      bStack_244 = *(bool *)((long)puVar5 + -4);
      _local_240 = *puVar5;
      pnVar10 = tol;
      pcVar11 = &local_230;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
      }
      local_230.exp = (tol->m_backend).exp;
      local_230.neg = (tol->m_backend).neg;
      local_230.fpclass = (tol->m_backend).fpclass;
      local_230.prec_elem = (tol->m_backend).prec_elem;
      if (local_230.data._M_elems[0] != 0 || local_230.fpclass != cpp_dec_float_finite) {
        local_230.neg = (bool)(local_230.neg ^ 1);
      }
      if (local_230.fpclass != cpp_dec_float_NaN && (fpclass_type)_local_240 != cpp_dec_float_NaN) {
        iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_2b8,&local_230);
        if (iVar4 < 0) {
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
          psVar12 = local_b0;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            *(uint *)psVar12 = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
            psVar12 = psVar12 + (ulong)bVar18 * -8 + 4;
          }
          local_40 = iStack_248;
          local_3c = bStack_244;
          local_38 = local_240;
          iStack_34 = iStack_23c;
          puVar8 = (uint *)((long)&(pnVar3->m_backend).data + lVar17 + -0x78);
          puVar9 = puVar8;
          pnVar10 = &local_130;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar10->m_backend).data._M_elems[0] = *puVar9;
            puVar9 = puVar9 + (ulong)bVar18 * -2 + 1;
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + ((ulong)bVar18 * -2 + 1) * 4);
          }
          local_130.m_backend.exp = puVar8[0x1c];
          local_130.m_backend.neg = SUB41(puVar8[0x1d],0);
          local_130.m_backend.fpclass = puVar8[0x1e];
          local_130.m_backend.prec_elem = puVar8[0x1f];
          pnVar10 = tol;
          pnVar13 = &local_1b0;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar13->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + ((ulong)bVar18 * -2 + 1) * 4);
            pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
          }
          local_1b0.m_backend.exp = (tol->m_backend).exp;
          local_1b0.m_backend.neg = (tol->m_backend).neg;
          local_1b0.m_backend.fpclass = (tol->m_backend).fpclass;
          local_1b0.m_backend.prec_elem = (tol->m_backend).prec_elem;
          steeppr::
          computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_230,local_b0,&local_130,&local_1b0,&local_130);
          pcVar11 = &local_230;
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
          }
          iStack_248 = local_230.exp;
          bStack_244 = local_230.neg;
          local_240 = local_230.fpclass;
          iStack_23c = local_230.prec_elem;
          if ((local_230.fpclass != cpp_dec_float_NaN) &&
             ((best->m_backend).fpclass != cpp_dec_float_NaN)) {
            iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_2b8,&best->m_backend);
            if (0 < iVar4) {
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
              pnVar10 = best;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pnVar10->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4)
                ;
                pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar10 + ((ulong)bVar18 * -2 + 1) * 4);
              }
              (best->m_backend).exp = iStack_248;
              (best->m_backend).neg = bStack_244;
              (best->m_backend).fpclass = local_240;
              (best->m_backend).prec_elem = iStack_23c;
              local_2e8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((this->
                                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).thesolver,(int)lVar15);
              local_2e0 = (ulong)local_2e8 >> 0x20;
            }
          }
        }
      }
      lVar15 = lVar15 + 1;
      lVar17 = lVar17 + 0x80;
    } while (lVar16 != lVar15);
    DVar6 = (DataKey)((ulong)local_2e8 & 0xffffffff | local_2e0 << 0x20);
  }
  return (SPxId)DVar6;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseCoDim(R& best, R tol)
{
   SPxId enterId;
   const R* test          = this->thesolver->test().get_const_ptr();
   const R* weights_ptr   = this->thesolver->weights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->coDim(); i < end; ++i)
   {
      x = test[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[i], tol);

         if(x > best)
         {
            best   = x;
            enterId = this->thesolver->id(i);
         }
      }
   }

   return enterId;
}